

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::dxt_hc::selector_indices_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  selector_indices_details *pSrc;
  
  if (num != 0) {
    lVar1 = 0;
    do {
      *(undefined2 *)((long)pDst_void + lVar1 + 4) = *(undefined2 *)((long)pSrc_void + lVar1 + 4);
      *(undefined4 *)((long)pDst_void + lVar1) = *(undefined4 *)((long)pSrc_void + lVar1);
      lVar1 = lVar1 + 6;
    } while ((ulong)num * 6 != lVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }